

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenRegVm_X86.cpp
# Opt level: O1

void CheckedReturnWrap(CodeGenRegVmStateContext *vmState,uintptr_t frameBase,uint typeId)

{
  uint *puVar1;
  char *__src;
  CodeGenRegVmContext *pCVar2;
  ExternTypeInfo *pEVar3;
  void *__dest;
  uint uVar4;
  
  puVar1 = vmState->tempStackArrayBase;
  __src = *(char **)puVar1;
  if ((frameBase <= __src) && (__src <= vmState->dataStackEnd)) {
    pCVar2 = vmState->ctx;
    NULLC::SetCollectMemory(false);
    pEVar3 = pCVar2->exTypes;
    if (pEVar3[typeId].field_8.arrSize == 0xffffffff) {
      uVar4 = puVar1[2];
      __dest = NULLC::AllocObject(pEVar3[pEVar3[typeId].field_11.subType].size * uVar4,
                                  pEVar3[typeId].field_11.subType);
      uVar4 = uVar4 * pCVar2->exTypes[pEVar3[typeId].field_11.subType].size;
    }
    else {
      uVar4 = pEVar3[typeId].size;
      __dest = NULLC::AllocObject(uVar4,typeId);
    }
    memcpy(__dest,__src,(ulong)uVar4);
    *(void **)puVar1 = __dest;
    NULLC::SetCollectMemory(false);
    return;
  }
  return;
}

Assistant:

void CheckedReturnWrap(CodeGenRegVmStateContext *vmState, uintptr_t frameBase, unsigned typeId)
{
	CodeGenRegVmContext &ctx = *vmState->ctx;

	uintptr_t frameEnd = uintptr_t(vmState->dataStackEnd);

	char *returnValuePtr = (char*)vmState->tempStackArrayBase;

	void *ptr;
	memcpy(&ptr, returnValuePtr, sizeof(ptr));

	if(uintptr_t(ptr) >= frameBase && uintptr_t(ptr) <= frameEnd)
	{
		// Don't want to trigger GC at this point
		NULLC::SetCollectMemory(false);

		ExternTypeInfo &type = ctx.exTypes[typeId];

		if(type.arrSize == ~0u)
		{
			unsigned length = *(int*)(returnValuePtr + sizeof(void*));

			char *copy = (char*)NULLC::AllocObject(ctx.exTypes[type.subType].size * length, type.subType);
			memcpy(copy, ptr, unsigned(ctx.exTypes[type.subType].size * length));
			memcpy(returnValuePtr, &copy, sizeof(copy));
		}
		else
		{
			unsigned objSize = type.size;

			char *copy = (char*)NULLC::AllocObject(objSize, typeId);
			memcpy(copy, ptr, objSize);
			memcpy(returnValuePtr, &copy, sizeof(copy));
		}

		NULLC::SetCollectMemory(false);
	}
}